

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O2

void __thiscall
Hpipe::CharItem::get_possible_paths
          (CharItem *this,Vec<Hpipe::Vec<Hpipe::CharItem_*>_> *paths,
          function<bool_(Hpipe::CharItem_*)> *f)

{
  CharItem *__args;
  pointer pCVar1;
  bool bVar2;
  pointer __args_00;
  vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>> *this_00;
  Vec<Hpipe::Vec<Hpipe::CharItem_*>_> front;
  Vec<Hpipe::CharItem_*> path;
  Vec<Hpipe::CharItem_*> new_path;
  vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_> local_88;
  function<bool_(Hpipe::CharItem_*)> *local_68;
  _Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> local_60;
  vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>> local_48 [24];
  
  local_88.
  super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = f;
  Vec<Hpipe::CharItem_*>::Vec((Vec<Hpipe::CharItem_*> *)&local_60,this);
  std::vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>::
  emplace_back<Hpipe::Vec<Hpipe::CharItem*>const&>
            ((vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>> *)
             &local_88,(Vec<Hpipe::CharItem_*> *)&local_60);
  std::_Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::~_Vector_base(&local_60)
  ;
  do {
    if (local_88.
        super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_88.
        super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::vector<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>::
      ~vector(&local_88);
      return;
    }
    std::vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::vector
              ((vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> *)&local_60,
               (vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> *)
               (local_88.
                super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    local_88.
    super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_88.
         super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::_Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::~_Vector_base
              ((_Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> *)
               local_88.
               super__Vector_base<Hpipe::Vec<Hpipe::CharItem_*>,_std::allocator<Hpipe::Vec<Hpipe::CharItem_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    __args = local_60._M_impl.super__Vector_impl_data._M_finish[-1];
    if ((__args->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
        super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (__args->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
        super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_0014bb40:
      std::vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>::
      emplace_back<Hpipe::Vec<Hpipe::CharItem*>const&>
                ((vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>
                  *)paths,(Vec<Hpipe::CharItem_*> *)&local_60);
    }
    else {
      bVar2 = std::function<bool_(Hpipe::CharItem_*)>::operator()(local_68,__args);
      if (!bVar2) goto LAB_0014bb40;
      pCVar1 = (__args->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
               super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (__args_00 = (__args->edges).
                       super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>.
                       super__Vector_base<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>._M_impl
                       .super__Vector_impl_data._M_start; __args_00 != pCVar1;
          __args_00 = __args_00 + 1) {
        std::vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::vector
                  ((vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> *)local_48,
                   (vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> *)&local_60);
        std::vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>>::
        emplace_back<Hpipe::CharItem*const&>(local_48,&__args_00->item);
        bVar2 = Vec<Hpipe::CharItem_*>::contains
                          ((Vec<Hpipe::CharItem_*> *)&local_60,&__args_00->item);
        this_00 = (vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>
                   *)paths;
        if (!bVar2) {
          this_00 = (vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>
                     *)&local_88;
        }
        std::vector<Hpipe::Vec<Hpipe::CharItem*>,std::allocator<Hpipe::Vec<Hpipe::CharItem*>>>::
        emplace_back<Hpipe::Vec<Hpipe::CharItem*>const&>(this_00,(Vec<Hpipe::CharItem_*> *)local_48)
        ;
        std::_Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::~_Vector_base
                  ((_Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_> *)local_48);
      }
    }
    std::_Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>::~_Vector_base
              (&local_60);
  } while( true );
}

Assistant:

void CharItem::get_possible_paths( Vec<Vec<CharItem *>> &paths, std::function<bool (CharItem *)> f ) {
    Vec<Vec<CharItem *>> front;
    front << this;
    while ( front.size() ) {
        Vec<CharItem *> path = front.back();
        front.pop_back();

        CharItem *last = path.back();
        if ( last->edges.size() ){
            if ( f( last ) ){
                for( CharEdge &t : last->edges ) {
                    Vec<CharItem *> new_path = path;
                    new_path << t.item;
                    if ( path.contains( t.item ) )
                        paths << new_path;
                    else
                        front << new_path;
                }
            } else
                paths << path;
        } else
            paths << path;
    }
}